

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int expect(int id)

{
  int iVar1;
  char *pcVar2;
  socklen_t *in_RDX;
  sockaddr *in_RSI;
  char buf [16];
  
  iVar1 = accept(id,in_RSI,in_RDX);
  if (iVar1 == 0) {
    pcVar2 = token_name(id);
    strcpy(buf,pcVar2);
    pcVar2 = token_name(last_id);
    err(E,"expected %s after %s",buf,pcVar2);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int expect(int id)
{
    char buf[16];
    if (accept(id))
        return 1;
    strcpy(buf, token_name(id));
    err(E, "expected %s after %s", buf, token_name(last_id));
    return 0;
}